

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void * lzham::lzham_realloc
                 (lzham_malloc_context context,void *p,size_t size,size_t *pActual_size,bool movable
                 )

{
  bool bVar1;
  uint uVar2;
  ulong *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  malloc_context *in_RDI;
  byte in_R8B;
  uint prev_size;
  malloc_context *pContext;
  void *p_new;
  size_t actual_size;
  uint in_stack_000001a4;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *local_40;
  ulong local_38;
  byte local_29;
  ulong *local_28;
  ulong local_20;
  void *local_18;
  malloc_context *local_10;
  void *local_8;
  
  local_29 = in_R8B & 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI == (malloc_context *)0x0) {
    lzham_assert(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
  }
  if (((ulong)local_18 & 0xf) == 0) {
    if (local_20 < 0x400000001) {
      local_38 = local_20;
      if (local_10->m_sig != 0x5749abcd) {
        lzham_assert(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4);
      }
      bVar1 = malloc_context::ptr_is_in_arena(local_10,local_18);
      if (bVar1) {
        if ((local_29 & 1) == 0) {
          return (void *)0x0;
        }
        uVar2 = malloc_context::arena_msize(local_10,local_18);
        if (uVar2 < local_20) {
          local_40 = malloc_context::arena_alloc(local_10,local_20);
          if (local_40 == (void *)0x0) {
            local_40 = (void *)(*(code *)g_pRealloc)(0,local_20,&local_38,1,g_pUser_data);
          }
          memcpy(local_40,local_18,(ulong)uVar2);
        }
        else {
          local_40 = local_18;
        }
      }
      else {
        local_40 = (void *)0x0;
        if (local_18 == (void *)0x0) {
          local_40 = malloc_context::arena_alloc(local_10,local_20);
        }
        if (local_40 == (void *)0x0) {
          local_40 = (void *)(*(code *)g_pRealloc)
                                       (local_18,local_20,&local_38,local_29 & 1,g_pUser_data);
        }
      }
      if (local_28 != (ulong *)0x0) {
        *local_28 = local_38;
      }
      local_8 = local_40;
    }
    else {
      lzham_mem_error((lzham_malloc_context)
                      CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
      local_8 = (void *)0x0;
    }
  }
  else {
    lzham_mem_error((lzham_malloc_context)
                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void* lzham_realloc(lzham_malloc_context context, void* p, size_t size, size_t* pActual_size, bool movable)
   {
      LZHAM_VERIFY(context);

      if ((ptr_bits_t)p & (LZHAM_MIN_ALLOC_ALIGNMENT - 1))
      {
         lzham_mem_error(context, "lzham_realloc: bad ptr");
         return NULL;
      }

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error(context, "lzham_malloc: size too big");
         return NULL;
      }

#if LZHAM_MEM_STATS
      size_t cur_size = p ? (*g_pMSize)(p, g_pUser_data) : 0;
#endif

      size_t actual_size = size;
      void *p_new;
      
      malloc_context *pContext = static_cast<malloc_context *>(context);
      
      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      if (pContext->ptr_is_in_arena(p))
      {
         if (!movable)
            return NULL;
         
         uint prev_size = pContext->arena_msize(p);
         if (size <= prev_size)
         {
            p_new = p;
         }
         else
         {
            p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
            if (!p_new)
            {
               p_new = (*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data);
            }
          
            memcpy(p_new, p, prev_size);
         }
      }
      else
      {
         p_new = NULL;

         if (!p)
            p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
         
         if (!p_new)
            p_new = (*g_pRealloc)(p, size, &actual_size, movable, g_pUser_data);
      }

      if (pActual_size)
         *pActual_size = actual_size;

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      int num_new_blocks = 0;
      if (p)
      {
         if (!p_new)
            num_new_blocks = -1;
      }
      else if (p_new)
      {
         num_new_blocks = 1;
      }
      pContext->update_total_allocated(num_new_blocks, static_cast<int64>(actual_size) - static_cast<int64>(cur_size));
#endif

      return p_new;
   }